

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::GeneratorsForTest::moveNext(GeneratorsForTest *this)

{
  pointer ppIVar1;
  char cVar2;
  int iVar3;
  pointer ppIVar4;
  bool bVar5;
  
  ppIVar4 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppIVar4 != ppIVar1;
  if (bVar5) {
    iVar3 = (*(*ppIVar4)->_vptr_IGeneratorInfo[2])();
    cVar2 = (char)iVar3;
    while (cVar2 == '\0') {
      ppIVar4 = ppIVar4 + 1;
      bVar5 = ppIVar4 != ppIVar1;
      if (ppIVar4 == ppIVar1) {
        return bVar5;
      }
      iVar3 = (*(*ppIVar4)->_vptr_IGeneratorInfo[2])();
      cVar2 = (char)iVar3;
    }
  }
  return bVar5;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }